

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

Pseudo * linearize_symbol_expression(Proc *proc,AstNode *expr)

{
  byte *pbVar1;
  SymbolType SVar2;
  uint uVar3;
  LuaSymbol *sym;
  C_MemoryAllocator *pCVar4;
  CompilerState *pCVar5;
  Constant *pCVar6;
  Pseudo *pPVar7;
  Pseudo *pPVar8;
  Pseudo *pPVar9;
  Constant local_40;
  
  sym = (expr->field_2).symbol_expr.var;
  SVar2 = sym->symbol_type;
  if (SVar2 == SYM_LOCAL) {
    pPVar9 = (sym->field_1).variable.pseudo;
  }
  else {
    if (SVar2 == SYM_UPVALUE) {
      pPVar9 = allocate_symbol_pseudo(proc,sym,(uint)*(ushort *)((long)&sym->field_1 + 0x20));
      return pPVar9;
    }
    if (SVar2 != SYM_GLOBAL) {
      pCVar5 = proc->linearizer->compiler_state;
      raviX_buffer_add_string(&pCVar5->error_message,"feature not yet implemented");
      longjmp((__jmp_buf_tag *)pCVar5->env,1);
    }
    if ((sym->field_1).variable.env == (LuaSymbol *)0x0) {
      __assert_fail("sym->variable.env",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x4f8,"Pseudo *linearize_symbol_expression(Proc *, AstNode *)");
    }
    local_40.field_2 = (anon_union_8_3_4e90b7ae_for_Constant_2)(sym->field_1).variable.var_name;
    local_40.type = 0x101;
    local_40.index = 0;
    pCVar6 = add_constant(proc,&local_40);
    pCVar4 = proc->linearizer->compiler_state->allocator;
    pPVar7 = (Pseudo *)(*pCVar4->calloc)(pCVar4->arena,1,0x30);
    uVar3 = *(uint *)pPVar7;
    *(uint *)pPVar7 = uVar3 & 0xfffffff0 | 5;
    (pPVar7->field_3).constant = pCVar6;
    *(uint *)pPVar7 = uVar3 & 0xfff00000 | 5 | (uint)pCVar6->index << 4;
    pPVar8 = allocate_symbol_pseudo(proc,(sym->field_1).variable.env,0);
    if (((undefined1  [48])*pPVar8 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x4d1,
                    "Pseudo *create_global_indexed_pseudo(Proc *, Pseudo *, Pseudo *, unsigned int)"
                   );
    }
    if (((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x4d2,
                    "Pseudo *create_global_indexed_pseudo(Proc *, Pseudo *, Pseudo *, unsigned int)"
                   );
    }
    uVar3 = expr->line_number;
    pCVar4 = proc->linearizer->compiler_state->allocator;
    pPVar9 = (Pseudo *)(*pCVar4->calloc)(pCVar4->arena,1,0x30);
    *(uint *)pPVar9 = *(uint *)pPVar9 & 0xfffffff0 | 0xe;
    (pPVar9->field_3).index_info.line_number = uVar3;
    (pPVar9->field_3).symbol = (LuaSymbol *)0x101ffffffff;
    (pPVar9->field_3).index_info.container = pPVar8;
    (pPVar9->field_3).index_info.key = pPVar7;
    (pPVar9->field_3).index_info.target_type = RAVI_TANY;
    pbVar1 = (byte *)((long)&pPVar9->field_3 + 0xc);
    *pbVar1 = *pbVar1 | 1;
  }
  return pPVar9;
}

Assistant:

static Pseudo *linearize_symbol_expression(Proc *proc, AstNode *expr)
{
	LuaSymbol *sym = expr->symbol_expr.var;
	if (sym->symbol_type == SYM_GLOBAL) {
		assert(sym->variable.env);
		const Constant *constant = allocate_string_constant(proc, sym->variable.var_name);
		Pseudo *operand_varname = allocate_constant_pseudo(proc, constant);
		Pseudo* operand_env = allocate_symbol_pseudo(proc, sym->variable.env, 0); // no register
		return create_global_indexed_pseudo(proc, operand_env, operand_varname, expr->line_number);
	} else if (sym->symbol_type == SYM_LOCAL) {
		return sym->variable.pseudo;
	} else if (sym->symbol_type == SYM_UPVALUE) {
		/* upvalue index is the position of upvalue in the function, we treat this as the pseudo register for
		 * the upvalue */
		return allocate_symbol_pseudo(proc, sym, sym->upvalue.upvalue_index);
	} else {
		handle_error(proc->linearizer->compiler_state, "feature not yet implemented");
		return NULL;
	}
}